

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall QtMWidgets::BlurEffect::drawBlur(BlurEffect *this,QPainter *p,QColor *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRect QVar4;
  QBrush local_50 [8];
  QRect dark;
  QColor c1;
  
  QVar4 = QWidget::rect(&this->super_QWidget);
  iVar1 = QVar4.x1;
  c1._0_8_ = *(undefined8 *)c;
  c1._8_8_ = *(undefined8 *)((long)&c->ct + 4);
  QColor::setAlpha((int)&c1);
  iVar2 = QVar4.x2;
  dark.y1 = QVar4.y1;
  if (this->orientation == Vertical) {
    iVar1 = iVar1 + ((iVar2 - iVar1) + 1) / 2 + -2;
    iVar2 = 4;
  }
  else {
    if (this->orientation == Horizontal) {
      dark.y1 = dark.y1 + ((QVar4.y2 - dark.y1) + 1) / 2 + -2;
      iVar2 = (iVar2 - iVar1) + 1;
      iVar3 = 4;
      dark.x1 = iVar1;
      goto LAB_00165585;
    }
    iVar2 = (iVar2 - iVar1) + 1;
  }
  iVar3 = (QVar4.y2 - dark.y1) + 1;
  dark.x1 = iVar1;
LAB_00165585:
  dark.x2 = iVar2 + dark.x1 + -1;
  dark.y2 = dark.y1 + iVar3 + -1;
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_50,&c1,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_50);
  QPainter::drawEllipse((QRect *)p);
  return;
}

Assistant:

void
BlurEffect::drawBlur( QPainter * p, const QColor & c )
{
	const QRect r = rect();

	const qreal realPressure = qMin(
		(qreal) qAbs( pressure ) / maxPressure, 1.0 );

	QColor c1 = c;
	c1.setAlpha( 255 * realPressure );

	const QRect dark(
		( orientation == Qt::Vertical ? r.x() + r.width() / 2 - 2 : r.x() ),
		( orientation == Qt::Horizontal ? r.y() + r.height() / 2 - 2 : r.y() ),
		( orientation == Qt::Vertical ? 4 : r.width() ),
		( orientation == Qt::Horizontal ? 4 : r.height() ) );

	p->setPen( Qt::NoPen );
	p->setBrush( c1 );
	p->drawEllipse( dark );
}